

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_ctr4x(uchar *out,uint32_t *ivw,uint64_t *sk_exp,uint nrounds)

{
  undefined4 in_ECX;
  uint in_stack_0000006c;
  uint64_t *in_stack_00000070;
  uint32_t *in_stack_00000078;
  uchar *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffe0;
  
  aes_ecb4x(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  inc4_be((uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  inc4_be((uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  inc4_be((uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  inc4_be((uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

static void aes_ctr4x(unsigned char out[64], uint32_t ivw[16], const uint64_t *sk_exp, unsigned int nrounds) {
    aes_ecb4x(out, ivw, sk_exp, nrounds);

    /* Increase counter for next 4 blocks */
    inc4_be(ivw + 3);
    inc4_be(ivw + 7);
    inc4_be(ivw + 11);
    inc4_be(ivw + 15);
}